

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infofnt_nuke(void)

{
  infofnt *piVar1;
  infofnt *ifnt;
  
  piVar1 = Infofnt;
  if (Infofnt->name != (char *)0x0) {
    string_free(Infofnt->name);
  }
  if (((byte)piVar1->field_0x19 >> 1 & 1) != 0) {
    XFreeFontSet(Metadpy->dpy,piVar1->fs);
  }
  return 0;
}

Assistant:

static errr Infofnt_nuke(void)
{
	infofnt *ifnt = Infofnt;

	/* Deal with 'name' */
	if (ifnt->name) {
		/* Free the name */
		string_free((void *) ifnt->name);
	}

	/* Nuke info if needed */
	if (ifnt->nuke) {
		/* Free the font */
		XFreeFontSet(Metadpy->dpy, ifnt->fs);
	}

	/* Success */
	return (0);
}